

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<SubArray,_Macro>_>::erase
          (Span<QHashPrivate::Node<SubArray,_Macro>_> *this,size_t bucket)

{
  bool bVar1;
  bool bVar2;
  uchar *puVar3;
  long in_RSI;
  Node<SubArray,_Macro> *in_RDI;
  uchar entry;
  
  bVar1 = *(bool *)((long)&(in_RDI->key).array.d.d + in_RSI);
  *(undefined1 *)((long)&(in_RDI->key).array.d.d + in_RSI) = 0xff;
  Entry::node((Entry *)(in_RDI[1].key.len + (ulong)bVar1 * 0x60));
  Node<SubArray,_Macro>::~Node(in_RDI);
  bVar2 = in_RDI[1].value.isVariadic;
  puVar3 = Entry::nextFree((Entry *)(in_RDI[1].key.len + (ulong)bVar1 * 0x60));
  *puVar3 = bVar2;
  in_RDI[1].value.isVariadic = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }